

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O2

void ** ialloc(mstate m,size_t n_elements,size_t *sizes,int opts,void **chunks)

{
  ulong uVar1;
  flag_t fVar2;
  mstate pmVar3;
  void *__s;
  ulong uVar4;
  undefined1 *puVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  ulong uVar7;
  void **ppvVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  
  ppvVar8 = (void **)CONCAT44(in_register_0000000c,opts);
  if (mparams.magic == 0) {
    init_mparams();
  }
  fVar2 = _gm_.mflags;
  uVar4 = 0x20;
  if (ppvVar8 == (void **)0x0) {
    if (m == (mstate)0x0) {
      ppvVar8 = (void **)malloc(0);
      return ppvVar8;
    }
    uVar6 = (long)m * 8 + 0x17U & 0xfffffffffffffff0;
    if ((ulong)((long)m * 8) < 0x17) {
      uVar6 = uVar4;
    }
  }
  else {
    if (m == (mstate)0x0) {
      return ppvVar8;
    }
    uVar6 = 0;
  }
  if (((ulong)sizes & 1) == 0) {
    uVar11 = 0;
    uVar9 = 0;
    for (pmVar3 = (mstate)0x0; m != pmVar3; pmVar3 = (mstate)((long)&pmVar3->smallmap + 1)) {
      uVar1 = *(ulong *)(n_elements + (long)pmVar3 * 8);
      uVar7 = uVar1 + 0x17 & 0xfffffffffffffff0;
      if (uVar1 < 0x17) {
        uVar7 = uVar4;
      }
      uVar9 = uVar9 + uVar7;
    }
  }
  else {
    uVar11 = *(ulong *)n_elements + 0x17 & 0xfffffffffffffff0;
    if (*(ulong *)n_elements < 0x17) {
      uVar11 = uVar4;
    }
    uVar9 = uVar11 * (long)m;
  }
  _gm_.mflags = _gm_.mflags & 0xfffffffe;
  __s = malloc((uVar6 + uVar9) - 8);
  if ((fVar2 & 1) != 0) {
    _gm_.mflags = _gm_.mflags | 1;
  }
  if (__s == (void *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    if ((_gm_.mflags & 2) != 0) {
      LOCK();
      UNLOCK();
      bVar12 = _gm_.mutex != 0;
      _gm_.mutex = 1;
      if (bVar12) {
        spin_acquire_lock(&_gm_.mutex);
      }
    }
    uVar4 = *(ulong *)((long)__s + -8);
    if ((uVar4 & 3) == 0) {
      _PDCLIB_assert99("Assertion failed: !is_mmapped(p), function ","ialloc",
                       ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 5098.\n"
                      );
    }
    uVar4 = uVar4 & 0xfffffffffffffff8;
    if (((ulong)sizes & 2) != 0) {
      memset(__s,0,(uVar4 - uVar6) - 8);
    }
    lVar10 = (long)__s + -0x10;
    if (ppvVar8 == (void **)0x0) {
      ppvVar8 = (void **)(lVar10 + uVar9 + 0x10);
      *(ulong *)(lVar10 + uVar9 + 8) = uVar4 - uVar9 | 3;
      uVar4 = uVar9;
    }
    for (puVar5 = (undefined1 *)0x0; ppvVar8[(long)puVar5] = (void *)(lVar10 + 0x10),
        (undefined1 *)((long)&m[-1].exts + 7) != puVar5; puVar5 = puVar5 + 1) {
      uVar6 = uVar11;
      if ((uVar11 == 0) &&
         (uVar9 = *(ulong *)(n_elements + (long)puVar5 * 8),
         uVar6 = uVar9 + 0x17 & 0xfffffffffffffff0, uVar9 < 0x17)) {
        uVar6 = 0x20;
      }
      uVar4 = uVar4 - uVar6;
      *(ulong *)(lVar10 + 8) = uVar6 | 3;
      lVar10 = lVar10 + uVar6;
    }
    *(ulong *)(lVar10 + 8) = uVar4 | 3;
    if ((_gm_.mflags & 2) != 0) {
      _gm_.mutex = 0;
    }
  }
  return ppvVar8;
}

Assistant:

static void** ialloc(mstate m,
                     size_t n_elements,
                     size_t* sizes,
                     int opts,
                     void* chunks[]) {

  size_t    element_size;   /* chunksize of each element, if all same */
  size_t    contents_size;  /* total size of elements */
  size_t    array_size;     /* request size of pointer array */
  void*     mem;            /* malloced aggregate space */
  mchunkptr p;              /* corresponding chunk */
  size_t    remainder_size; /* remaining bytes while splitting */
  void**    marray;         /* either "chunks" or malloced ptr array */
  mchunkptr array_chunk;    /* chunk for malloced ptr array */
  flag_t    was_enabled;    /* to disable mmap */
  size_t    size;
  size_t    i;

  ensure_initialization();
  /* compute array length, if needed */
  if (chunks != 0) {
    if (n_elements == 0)
      return chunks; /* nothing to do */
    marray = chunks;
    array_size = 0;
  }
  else {
    /* if empty req, must still return chunk representing empty array */
    if (n_elements == 0)
      return (void**)internal_malloc(m, 0);
    marray = 0;
    array_size = request2size(n_elements * (sizeof(void*)));
  }

  /* compute total element size */
  if (opts & 0x1) { /* all-same-size */
    element_size = request2size(*sizes);
    contents_size = n_elements * element_size;
  }
  else { /* add up all the sizes */
    element_size = 0;
    contents_size = 0;
    for (i = 0; i != n_elements; ++i)
      contents_size += request2size(sizes[i]);
  }

  size = contents_size + array_size;

  /*
     Allocate the aggregate chunk.  First disable direct-mmapping so
     malloc won't use it, since we would not be able to later
     free/realloc space internal to a segregated mmap region.
  */
  was_enabled = use_mmap(m);
  disable_mmap(m);
  mem = internal_malloc(m, size - CHUNK_OVERHEAD);
  if (was_enabled)
    enable_mmap(m);
  if (mem == 0)
    return 0;

  if (PREACTION(m)) return 0;
  p = mem2chunk(mem);
  remainder_size = chunksize(p);

  assert(!is_mmapped(p));

  if (opts & 0x2) {       /* optionally clear the elements */
    memset((size_t*)mem, 0, remainder_size - SIZE_T_SIZE - array_size);
  }

  /* If not provided, allocate the pointer array as final part of chunk */
  if (marray == 0) {
    size_t  array_chunk_size;
    array_chunk = chunk_plus_offset(p, contents_size);
    array_chunk_size = remainder_size - contents_size;
    marray = (void**) (chunk2mem(array_chunk));
    set_size_and_pinuse_of_inuse_chunk(m, array_chunk, array_chunk_size);
    remainder_size = contents_size;
  }

  /* split out elements */
  for (i = 0; ; ++i) {
    marray[i] = chunk2mem(p);
    if (i != n_elements-1) {
      if (element_size != 0)
        size = element_size;
      else
        size = request2size(sizes[i]);
      remainder_size -= size;
      set_size_and_pinuse_of_inuse_chunk(m, p, size);
      p = chunk_plus_offset(p, size);
    }
    else { /* the final element absorbs any overallocation slop */
      set_size_and_pinuse_of_inuse_chunk(m, p, remainder_size);
      break;
    }
  }

#if DEBUG
  if (marray != chunks) {
    /* final element must have exactly exhausted chunk */
    if (element_size != 0) {
      assert(remainder_size == element_size);
    }
    else {
      assert(remainder_size == request2size(sizes[i]));
    }
    check_inuse_chunk(m, mem2chunk(marray));
  }
  for (i = 0; i != n_elements; ++i)
    check_inuse_chunk(m, mem2chunk(marray[i]));

#endif /* DEBUG */

  POSTACTION(m);
  return marray;
}